

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O1

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<char[10]>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,char (*v) [10])

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  pointer pbVar5;
  size_t i;
  
  if ((idx < (ulong)((long)(sv->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(sv->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5)) &&
     (pbVar5 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     idx < (ulong)((long)(sv->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))) {
    lVar4 = idx << 5;
    bVar3 = false;
    do {
      iVar1 = ::std::__cxx11::string::compare((char *)((long)&(pbVar5->_M_dataplus)._M_p + lVar4));
      if ((iVar1 != 0) || (bVar3)) {
        pbVar5 = (sv->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ss,*(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar4),
                   *(long *)((long)&pbVar5->_M_string_length + lVar4));
      }
      else {
        sVar2 = strlen(*v);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)ss,*v,sVar2);
        bVar3 = true;
      }
      idx = idx + 1;
      pbVar5 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (idx < (ulong)((long)(sv->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v) {
  if (idx >= sv.size()) {
    return ss;
  }

  // Print remaininig items
  bool fmt_printed{false};

  for (size_t i = idx; i < sv.size(); i++) {
    if (sv[i] == "{}") {
      if (fmt_printed) {
        ss << sv[i];
      } else {
        ss << v;
        fmt_printed = true;
      }
    } else {
      ss << sv[i];
    }
  }

  return ss;
}